

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.cpp
# Opt level: O1

void __thiscall CVmMetaTable::ensure_space(CVmMetaTable *this,size_t entries,size_t increment)

{
  ulong uVar1;
  vm_meta_entry_t *pvVar2;
  
  if (this->alloc_ <= entries) {
    uVar1 = this->alloc_ + increment;
    if (uVar1 <= entries) {
      uVar1 = entries;
    }
    this->alloc_ = uVar1;
    if (this->table_ == (vm_meta_entry_t *)0x0) {
      pvVar2 = (vm_meta_entry_t *)malloc(uVar1 * 0x38);
    }
    else {
      pvVar2 = (vm_meta_entry_t *)realloc(this->table_,uVar1 * 0x38);
    }
    this->table_ = pvVar2;
  }
  return;
}

Assistant:

void CVmMetaTable::ensure_space(size_t entries, size_t increment)
{
    /* if we don't have enough space, allocate more */
    if (entries >= alloc_)
    {
        size_t new_size;
        
        /* increase the allocation size by the given increment */
        alloc_ += increment;

        /* if it's still too small, bump it up to the required size */
        if (alloc_ < entries)
            alloc_ = entries;

        /* compute the new size */
        new_size = alloc_ * sizeof(table_[0]);
        
        /* 
         *   if we have a table already, reallocate it at the larger size;
         *   otherwise, allocate a new table 
         */
        if (table_ != 0)
            table_ = (vm_meta_entry_t *)t3realloc(table_, new_size);
        else
            table_ = (vm_meta_entry_t *)t3malloc(new_size);
    }
}